

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O2

int __thiscall
chrono::ChArchiveExplorer::wildcard_compare(ChArchiveExplorer *this,char *wildcard,char *string)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  
  for (; (cVar5 = *string, cVar5 != '\0' && (cVar1 = *wildcard, cVar1 != '*'));
      wildcard = wildcard + 1) {
    if (cVar1 != cVar5 && cVar1 != '?') {
      return 0;
    }
    string = string + 1;
  }
  pcVar4 = (char *)0x0;
  pcVar2 = (char *)0x0;
  do {
    if (cVar5 == '\0') {
      do {
        cVar5 = *wildcard;
        wildcard = wildcard + 1;
      } while (cVar5 == '*');
      return (uint)(cVar5 == '\0');
    }
    cVar1 = *wildcard;
    if (cVar1 == '*') {
      if (wildcard[1] == '\0') {
        return 1;
      }
      pcVar4 = wildcard + 1;
      pcVar3 = string + 1;
      wildcard = pcVar4;
    }
    else if (cVar1 == cVar5 || cVar1 == '?') {
      pcVar3 = pcVar2;
      string = string + 1;
      wildcard = wildcard + 1;
    }
    else {
      pcVar3 = pcVar2 + 1;
      string = pcVar2;
      wildcard = pcVar4;
    }
    cVar5 = *string;
    pcVar2 = pcVar3;
  } while( true );
}

Assistant:

int wildcard_compare(const char* wildcard, const char* string) {
        const char* cp = 0, * mp = 0;

        while ((*string) && (*wildcard != '*')) {
            if ((*wildcard != *string) && (*wildcard != '?')) {
                return 0;
            }
            wildcard++;
            string++;
        }

        while (*string) {
            if (*wildcard == '*') {
                if (!*++wildcard) {
                    return 1;
                }
                mp = wildcard;
                cp = string + 1;
            } else {
                if ((*wildcard == *string) || (*wildcard == '?')) {
                    wildcard++;
                    string++;
                } else {
                    wildcard = mp;
                    string = cp++;
                }
            }
        }

        while (*wildcard == '*') {
            wildcard++;
        }
        return !*wildcard;
    }